

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
* tinyusdz::tydra::GetBlendShapes
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
             *__return_storage_ptr__,Stage *stage,Prim *prim,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  long lVar4;
  bool bVar5;
  GeomMesh *pGVar6;
  BlendShape *pBVar7;
  string *psVar8;
  Path *pPVar9;
  long lVar10;
  ulong uVar11;
  Prim *bsprim;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> blendShapeNames;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  dst;
  Prim *local_e0;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>
  local_c0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  local_98;
  long *local_78 [2];
  long local_68 [2];
  Stage *local_58;
  string local_50;
  
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar6 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(&prim->_data,false);
  if (pGVar6 == (GeomMesh *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_004fb439;
  }
  bVar5 = (pGVar6->blendShapes)._attrib.has_value_;
  if (((((bVar5 == false) &&
        ((pGVar6->blendShapes)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (pGVar6->blendShapes)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start)) && ((pGVar6->blendShapes)._value_empty == false)) &&
      ((pGVar6->blendShapes)._blocked != true)) || ((pGVar6->blendShapeTargets).has_value_ != true))
  {
LAB_004fb40e:
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_98.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_98.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_98.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_004fb439;
  }
  local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bVar5 == false) goto joined_r0x004fb165;
  std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
            (&local_d8,
             (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
             &(pGVar6->blendShapes)._attrib.contained);
  if ((pGVar6->blendShapeTargets).has_value_ == false) goto LAB_004fb3a9;
  iVar2 = *(int *)&(pGVar6->blendShapeTargets).contained;
  if (iVar2 == 2) {
    if ((long)local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
              .super__Vector_impl_data._M_start >> 5 ==
        (*(long *)((long)&(pGVar6->blendShapeTargets).contained + 0xe0) -
         *(long *)((long)&(pGVar6->blendShapeTargets).contained + 0xd8) >> 4) * 0x4ec4ec4ec4ec4ec5)
    {
LAB_004fb1b0:
      local_58 = stage;
      if ((pGVar6->blendShapeTargets).has_value_ == true) {
        uVar11 = 0xffffffffffffffff;
        lVar10 = 0;
        do {
          lVar4 = *(long *)((long)&(pGVar6->blendShapeTargets).contained + 0xd8);
          uVar11 = uVar11 + 1;
          if ((ulong)((*(long *)((long)&(pGVar6->blendShapeTargets).contained + 0xe0) - lVar4 >> 4)
                     * 0x4ec4ec4ec4ec4ec5) <= uVar11) {
            ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_d8);
            goto LAB_004fb40e;
          }
          pPVar9 = (Path *)(lVar4 + lVar10);
          local_e0 = (Prim *)0x0;
          psVar8 = err;
          bVar5 = Stage::find_prim_at_path(local_58,pPVar9,&local_e0,err);
          if (!bVar5) goto LAB_004fb3ea;
          if (local_e0 == (Prim *)0x0) goto joined_r0x004fb165;
          pBVar7 = tinyusdz::value::Value::as<tinyusdz::BlendShape>(&local_e0->_data,false);
          if (pBVar7 == (BlendShape *)0x0) {
            if (err != (string *)0x0) {
              local_78[0] = local_68;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_78,"{} is not BlendShape Prim.","");
              Path::full_path_name_abi_cxx11_(&local_50,pPVar9);
              fmt::format<std::__cxx11::string>
                        ((string *)&local_c0,(fmt *)local_78,(string *)&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar8
                        );
              ::std::__cxx11::string::_M_append((char *)err,(ulong)local_c0.first._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0.first._M_dataplus._M_p != &local_c0.first.field_2) {
                operator_delete(local_c0.first._M_dataplus._M_p,
                                local_c0.first.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_78[0] != local_68) {
                operator_delete(local_78[0],local_68[0] + 1);
              }
            }
            (__return_storage_ptr__->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          else {
            local_c0.first._M_dataplus._M_p = (pointer)&local_c0.first.field_2;
            pcVar3 = ((local_d8.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_start)->str_)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,pcVar3,
                       pcVar3 + ((local_d8.
                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->str_)._M_string_length
                      );
            local_c0.second = pBVar7;
            ::std::
            vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
            ::emplace_back<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>
                      ((vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
                        *)&local_98,&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0.first._M_dataplus._M_p != &local_c0.first.field_2) {
              operator_delete(local_c0.first._M_dataplus._M_p,
                              local_c0.first.field_2._M_allocated_capacity + 1);
            }
          }
          if (pBVar7 == (BlendShape *)0x0) goto LAB_004fb3f8;
          lVar10 = lVar10 + 0xd0;
        } while ((pGVar6->blendShapeTargets).has_value_ != false);
      }
LAB_004fb3a9:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Relationship>::value() const [T = tinyusdz::Relationship]"
                   );
    }
joined_r0x004fb165:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
LAB_004fb3ea:
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    if ((iVar2 != 1) ||
       ((long)local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
              .super__Vector_impl_data._M_start != 0x20)) goto joined_r0x004fb165;
    pPVar9 = (Path *)((long)&(pGVar6->blendShapeTargets).contained + 8);
    local_e0 = (Prim *)0x0;
    psVar8 = err;
    bVar5 = Stage::find_prim_at_path(stage,pPVar9,&local_e0,err);
    if (!bVar5) goto LAB_004fb3ea;
    if (local_e0 == (Prim *)0x0) goto joined_r0x004fb165;
    pBVar7 = tinyusdz::value::Value::as<tinyusdz::BlendShape>(&local_e0->_data,false);
    if (pBVar7 == (BlendShape *)0x0) {
      if (err != (string *)0x0) {
        local_78[0] = local_68;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"{} is not BlendShape Prim.\n","");
        Path::full_path_name_abi_cxx11_(&local_50,pPVar9);
        fmt::format<std::__cxx11::string>
                  ((string *)&local_c0,(fmt *)local_78,(string *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar8);
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_c0.first._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.first._M_dataplus._M_p != &local_c0.first.field_2) {
          operator_delete(local_c0.first._M_dataplus._M_p,
                          local_c0.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
      }
      (__return_storage_ptr__->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      paVar1 = &local_c0.first.field_2;
      pcVar3 = ((local_d8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                 _M_impl.super__Vector_impl_data._M_start)->str_)._M_dataplus._M_p;
      local_c0.first._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar3,
                 pcVar3 + ((local_d8.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start)->str_)._M_string_length);
      local_c0.second = pBVar7;
      ::std::
      vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
      ::emplace_back<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>
                ((vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
                  *)&local_98,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.first._M_dataplus._M_p,
                        local_c0.first.field_2._M_allocated_capacity + 1);
      }
    }
    if (pBVar7 != (BlendShape *)0x0) goto LAB_004fb1b0;
  }
LAB_004fb3f8:
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_d8);
LAB_004fb439:
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ::~vector(&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::string, const tinyusdz::BlendShape *>>
GetBlendShapes(const tinyusdz::Stage &stage, const tinyusdz::Prim &prim,
               std::string *err) {
  std::vector<std::pair<std::string, const tinyusdz::BlendShape *>> dst;

  auto *pmesh = prim.as<GeomMesh>();
  if (!pmesh) {
    if (err) {
      (*err) += "Prim must be GeomMesh.\n";
    }
    return std::vector<std::pair<std::string, const tinyusdz::BlendShape *>>{};
  }

  //
  // BlendShape Prim may not be a child of GeomMesh. So need to search Prim in
  // Stage
  //
  if (pmesh->blendShapes.authored() && pmesh->blendShapeTargets.has_value()) {
    // TODO: connection?
    std::vector<value::token> blendShapeNames;

    if (!pmesh->blendShapes.get_value(&blendShapeNames)) {
      if (err) {
        (*err) += "Failed to get `skel:blendShapes` attribute.\n";
      }
      return std::vector<
          std::pair<std::string, const tinyusdz::BlendShape *>>{};
    }

    if (pmesh->blendShapeTargets.value().is_path()) {
      if (blendShapeNames.size() != 1) {
        if (err) {
          (*err) +=
              "Array size mismatch with `skel:blendShapes` and "
              "`skel:blendShapeTargets`.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      const Path &targetPath = pmesh->blendShapeTargets.value().targetPath;
      const Prim *bsprim{nullptr};
      if (!stage.find_prim_at_path(targetPath, bsprim, err)) {
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
      if (!bsprim) {
        if (err) {
          (*err) += "Internal error. BlendShape Prim is nullptr.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      if (const auto *bs = bsprim->as<BlendShape>()) {
        dst.push_back(std::make_pair(blendShapeNames[0].str(), bs));
      } else {
        if (err) {
          (*err) += fmt::format("{} is not BlendShape Prim.\n",
                                targetPath.full_path_name());
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

    } else if (pmesh->blendShapeTargets.value().is_pathvector()) {
      if (blendShapeNames.size() !=
          pmesh->blendShapeTargets.value().targetPathVector.size()) {
        if (err) {
          (*err) +=
              "Array size mismatch with `skel:blendShapes` and "
              "`skel:blendShapeTargets`.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
    } else {
      if (err) {
        (*err) +=
            "Invalid or unsupported definition of `skel:blendShapeTargets` "
            "relationship.\n";
      }
      return std::vector<
          std::pair<std::string, const tinyusdz::BlendShape *>>{};
    }

    for (size_t i = 0;
         i < pmesh->blendShapeTargets.value().targetPathVector.size(); i++) {
      const Path &targetPath =
          pmesh->blendShapeTargets.value().targetPathVector[i];
      const Prim *bsprim{nullptr};
      if (!stage.find_prim_at_path(targetPath, bsprim, err)) {
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
      if (!bsprim) {
        if (err) {
          (*err) += "Internal error. BlendShape Prim is nullptr.";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      if (const auto *bs = bsprim->as<BlendShape>()) {
        dst.push_back(std::make_pair(blendShapeNames[0].str(), bs));
      } else {
        if (err) {
          (*err) += fmt::format("{} is not BlendShape Prim.",
                                targetPath.full_path_name());
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
    }
  }

  return dst;
}